

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

ssize_t __thiscall
QTextStreamPrivate::write(QTextStreamPrivate *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  QLatin1StringView str;
  QLatin1StringView s;
  qsizetype qVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QTextStreamPrivate *in_stack_00000018;
  qsizetype in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  str.m_data._4_4_ = in_register_00000034;
  str.m_data._0_4_ = __fd;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->string == (QString *)0x0) {
    s.m_data = in_stack_ffffffffffffffd8;
    s.m_size = (qsizetype)__buf;
    QString::operator+=((QString *)this,s);
    qVar2 = QString::size(&this->writeBuffer);
    if (0x4000 < qVar2) {
      flushWriteBuffer(in_stack_00000018);
    }
  }
  else {
    str.m_size = in_stack_ffffffffffffffd0;
    QString::append((QString *)this,str);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextStreamPrivate::write(QLatin1StringView data)
{
    if (string) {
        // ### What about seek()??
        string->append(data);
    } else {
        writeBuffer += data;
        if (writeBuffer.size() > QTEXTSTREAM_BUFFERSIZE)
            flushWriteBuffer();
    }
}